

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void SetClipboardTextFn_DefaultImpl(void *param_1,char *text)

{
  size_t __n;
  value_type_conflict1 *pvVar1;
  ImVector<char> *this;
  
  this = &GImGui->PrivateClipboard;
  ImVector<char>::clear(this);
  __n = strlen(text);
  ImVector<char>::resize(this,(int)__n + 1);
  pvVar1 = ImVector<char>::operator[](this,0);
  memcpy(pvVar1,text,__n);
  pvVar1 = ImVector<char>::operator[](this,(int)__n);
  *pvVar1 = '\0';
  return;
}

Assistant:

static void SetClipboardTextFn_DefaultImpl(void*, const char* text)
{
    ImGuiContext& g = *GImGui;
    g.PrivateClipboard.clear();
    const char* text_end = text + strlen(text);
    g.PrivateClipboard.resize((int)(text_end - text) + 1);
    memcpy(&g.PrivateClipboard[0], text, (size_t)(text_end - text));
    g.PrivateClipboard[(int)(text_end - text)] = 0;
}